

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationZZ<std::complex<double>_>::matrix(RotationZZ<std::complex<double>_> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined4 *puVar5;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<double>_> SVar6;
  
  (this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)0x4;
  puVar5 = (undefined4 *)operator_new__(0x100);
  *(undefined4 **)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable = puVar5;
  *(undefined8 *)(puVar5 + 4) = 0;
  *(undefined8 *)(puVar5 + 6) = 0;
  *(undefined8 *)(puVar5 + 8) = 0;
  *(undefined8 *)(puVar5 + 10) = 0;
  *(undefined8 *)(puVar5 + 0xc) = 0;
  *(undefined8 *)(puVar5 + 0xe) = 0;
  *(undefined8 *)(puVar5 + 0x10) = 0;
  *(undefined8 *)(puVar5 + 0x12) = 0;
  uVar1 = *(undefined4 *)(in_RSI + 0x18);
  uVar2 = *(undefined4 *)(in_RSI + 0x1c);
  uVar3 = *(undefined4 *)(in_RSI + 0x20);
  uVar4 = *(uint *)(in_RSI + 0x24);
  *puVar5 = uVar1;
  puVar5[1] = uVar2;
  puVar5[2] = uVar3;
  puVar5[3] = uVar4 ^ 0x80000000;
  puVar5[0x14] = uVar1;
  puVar5[0x15] = uVar2;
  puVar5[0x16] = uVar3;
  puVar5[0x17] = uVar4;
  *(undefined8 *)(puVar5 + 0x24) = 0;
  *(undefined8 *)(puVar5 + 0x26) = 0;
  *(undefined8 *)(puVar5 + 0x20) = 0;
  *(undefined8 *)(puVar5 + 0x22) = 0;
  *(undefined8 *)(puVar5 + 0x1c) = 0;
  *(undefined8 *)(puVar5 + 0x1e) = 0;
  *(undefined8 *)(puVar5 + 0x18) = 0;
  *(undefined8 *)(puVar5 + 0x1a) = 0;
  puVar5[0x28] = uVar1;
  puVar5[0x29] = uVar2;
  puVar5[0x2a] = uVar3;
  puVar5[0x2b] = uVar4;
  *(undefined8 *)(puVar5 + 0x38) = 0;
  *(undefined8 *)(puVar5 + 0x3a) = 0;
  *(undefined8 *)(puVar5 + 0x34) = 0;
  *(undefined8 *)(puVar5 + 0x36) = 0;
  *(undefined8 *)(puVar5 + 0x30) = 0;
  *(undefined8 *)(puVar5 + 0x32) = 0;
  *(undefined8 *)(puVar5 + 0x2c) = 0;
  *(undefined8 *)(puVar5 + 0x2e) = 0;
  puVar5[0x3c] = uVar1;
  puVar5[0x3d] = uVar2;
  puVar5[0x3e] = uVar3;
  puVar5[0x3f] = uVar4 ^ 0x80000000;
  SVar6.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar6.size_ = (size_type_conflict)this;
  return SVar6;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T a = T(this->cos(),-this->sin()) ;
          const T b = T(this->cos(), this->sin()) ;
          return qclab::dense::SquareMatrix< T >( a , 0 , 0 , 0 ,
                                                  0 , b , 0 , 0 ,
                                                  0 , 0 , b , 0 ,
                                                  0 , 0 , 0 , a ) ;
        }